

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O0

Vector<float,_2> __thiscall
deqp::gles2::Functional::safeCoords<2>
          (Functional *this,Vector<float,_2> *raw,Vector<int,_2> *scale,Vector<float,_2> *fraction)

{
  int scale_00;
  Vector<float,_2> VVar1;
  float *pfVar2;
  int *piVar3;
  float extraout_XMM0_Da;
  float fVar4;
  float extraout_XMM0_Db;
  float fVar5;
  undefined4 local_2c;
  int i;
  Vector<float,_2> *fraction_local;
  Vector<int,_2> *scale_local;
  Vector<float,_2> *raw_local;
  Vector<float,_2> *result;
  
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)this);
  fVar4 = extraout_XMM0_Da;
  fVar5 = extraout_XMM0_Db;
  for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
    pfVar2 = tcu::Vector<float,_2>::operator[](raw,local_2c);
    fVar4 = *pfVar2;
    piVar3 = tcu::Vector<int,_2>::operator[](scale,local_2c);
    scale_00 = *piVar3;
    pfVar2 = tcu::Vector<float,_2>::operator[](fraction,local_2c);
    fVar4 = safeCoord(fVar4,scale_00,*pfVar2);
    pfVar2 = tcu::Vector<float,_2>::operator[]((Vector<float,_2> *)this,local_2c);
    fVar5 = 0.0;
    *pfVar2 = fVar4;
  }
  VVar1.m_data[1] = fVar5;
  VVar1.m_data[0] = fVar4;
  return (Vector<float,_2>)VVar1.m_data;
}

Assistant:

static inline tcu::Vector<float, Size> safeCoords (const tcu::Vector<float, Size>& raw, const tcu::Vector<int, Size>& scale, const tcu::Vector<float, Size>& fraction)
{
	tcu::Vector<float, Size> result;
	for (int i = 0; i < Size; i++)
		result[i] = safeCoord(raw[i], scale[i], fraction[i]);
	return result;
}